

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall
MatroskaDemuxer::ebml_read_binary(MatroskaDemuxer *this,uint32_t *id,uint8_t **binary,int *size)

{
  int iVar1;
  uint uVar2;
  uint8_t *binary_00;
  undefined4 *puVar3;
  int64_t rlength;
  ostringstream ss;
  uint *local_1c0;
  undefined8 local_1b8;
  uint local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  uint local_1a0 [2];
  ostringstream local_198 [376];
  
  iVar1 = ebml_read_element_id(this,id,(int *)0x0);
  if (-1 < iVar1) {
    this->peek_id = 0;
    iVar1 = ebml_read_num(this,8,(int64_t *)local_1a0);
    if (-1 < iVar1) {
      *size = local_1a0[0];
      binary_00 = (uint8_t *)operator_new__((long)(int)local_1a0[0]);
      *binary = binary_00;
      uVar2 = IOContextDemuxer::get_buffer(&this->super_IOContextDemuxer,binary_00,local_1a0[0]);
      iVar1 = 0;
      if (uVar2 != *size) {
        std::__cxx11::ostringstream::ostringstream(local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"Matroska parser: read error at pos ",0x23);
        std::ostream::_M_insert<long>((long)local_198);
        puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar3 = 900;
        *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
        if (local_1c0 == &local_1b0) {
          puVar3[6] = local_1b0;
          puVar3[7] = uStack_1ac;
          puVar3[8] = uStack_1a8;
          puVar3[9] = uStack_1a4;
        }
        else {
          *(uint **)(puVar3 + 2) = local_1c0;
          *(ulong *)(puVar3 + 6) = CONCAT44(uStack_1ac,local_1b0);
        }
        *(undefined8 *)(puVar3 + 4) = local_1b8;
        local_1b0 = local_1b0 & 0xffffff00;
        __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
    }
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_binary(uint32_t *id, uint8_t **binary, int *size)
{
    int64_t rlength;
    int res;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&rlength)) < 0)
        return res;
    *size = static_cast<int>(rlength);

    *binary = new uint8_t[*size];
    if (!(*binary))
    {
        THROW(ERR_COMMON_MEMORY, "Memory allocation error")
    }

    if (static_cast<int>(get_buffer(*binary, *size)) != *size)
    {
        THROW(ERR_MATROSKA_PARSE, "Matroska parser: read error at pos " << m_processedBytes)
    }
    return 0;
}